

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
          (Marray<int,_std::allocator<unsigned_long>_> *this)

{
  int *__p;
  size_t __t;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  
  __p = (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_;
  __t = View<int,_false,_std::allocator<unsigned_long>_>::size
                  (&this->super_View<int,_false,_std::allocator<unsigned_long>_>);
  __gnu_cxx::new_allocator<int>::deallocate((new_allocator<int> *)&this->field_0x40,__p,__t);
  std::allocator<int>::~allocator((allocator<int> *)&this->field_0x40);
  View<int,_false,_std::allocator<unsigned_long>_>::~View
            (&this->super_View<int,_false,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

inline
Marray<T, A>::~Marray()
{
    dataAllocator_.deallocate(this->data_, this->size());
}